

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

LinkInterfaceLibraries * __thiscall
cmTarget::GetLinkInterfaceLibraries
          (cmTarget *this,string *config,cmTarget *head,bool usage_requirements_only)

{
  bool bVar1;
  TargetType TVar2;
  cmTargetInternals *pcVar3;
  pointer ppVar4;
  cmTarget *local_d8;
  byte local_b9;
  map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
  *local_a8;
  OptionalLinkInterface *iface;
  _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>
  local_78;
  _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>
  local_70 [3];
  map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
  *local_58;
  HeadToLinkInterfaceMap *hm;
  string CONFIG;
  cmTarget *pcStack_28;
  bool usage_requirements_only_local;
  cmTarget *head_local;
  string *config_local;
  cmTarget *this_local;
  
  CONFIG.field_2._M_local_buf[0xf] = usage_requirements_only;
  pcStack_28 = head;
  head_local = (cmTarget *)config;
  config_local = (string *)this;
  bVar1 = IsImported(this);
  if (bVar1) {
    this_local = (cmTarget *)
                 GetImportLinkInterface
                           (this,(string *)head_local,pcStack_28,
                            (bool)(CONFIG.field_2._M_local_buf[0xf] & 1));
  }
  else {
    TVar2 = GetType(this);
    if ((TVar2 != EXECUTABLE) || (bVar1 = IsExecutableWithExports(this), bVar1)) {
      cmsys::SystemTools::UpperCase((string *)&hm,(string *)head_local);
      if ((CONFIG.field_2._M_local_buf[0xf] & 1U) == 0) {
        pcVar3 = cmTargetInternalPointer::operator->(&this->Internal);
        local_a8 = &std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap>_>_>
                    ::operator[](&pcVar3->LinkInterfaceMap,(key_type *)&hm)->
                    super_map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
        ;
      }
      else {
        pcVar3 = cmTargetInternalPointer::operator->(&this->Internal);
        local_a8 = &std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTargetInternals::HeadToLinkInterfaceMap>_>_>
                    ::operator[](&pcVar3->LinkInterfaceUsageRequirementsOnlyMap,(key_type *)&hm)->
                    super_map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
        ;
      }
      local_58 = local_a8;
      bVar1 = std::
              map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
              ::empty(local_a8);
      local_b9 = 0;
      if (!bVar1) {
        local_70[0]._M_node =
             (_Base_ptr)
             std::
             map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
             ::begin(local_58);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>
                 ::operator->(local_70);
        local_b9 = (ppVar4->second).super_LinkInterface.field_0x6c ^ 0xff;
      }
      if ((local_b9 & 1) == 0) {
        local_d8 = (cmTarget *)
                   std::
                   map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
                   ::operator[](local_58,&stack0xffffffffffffffd8);
        if (((local_d8->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_color & 0x100) == _S_red) {
          *(byte *)((long)&(local_d8->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header.
                           _M_header._M_color + 1) = 1;
          pcVar3 = cmTargetInternalPointer::operator->(&this->Internal);
          cmTargetInternals::ComputeLinkInterfaceLibraries
                    (pcVar3,this,(string *)head_local,(OptionalLinkInterface *)local_d8,pcStack_28,
                     (bool)(CONFIG.field_2._M_local_buf[0xf] & 1));
        }
        if (((local_d8->LinkDirectoriesEmmitted)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_color & 0x1000000) == _S_red) {
          local_d8 = (cmTarget *)0x0;
        }
        this_local = local_d8;
      }
      else {
        local_78._M_node =
             (_Base_ptr)
             std::
             map<const_cmTarget_*,_cmTargetInternals::OptionalLinkInterface,_std::less<const_cmTarget_*>,_std::allocator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>_>
             ::begin(local_58);
        ppVar4 = std::
                 _Rb_tree_iterator<std::pair<const_cmTarget_*const,_cmTargetInternals::OptionalLinkInterface>_>
                 ::operator->(&local_78);
        this_local = (cmTarget *)&ppVar4->second;
      }
      std::__cxx11::string::~string((string *)&hm);
    }
    else {
      this_local = (cmTarget *)0x0;
    }
  }
  return (LinkInterfaceLibraries *)this_local;
}

Assistant:

cmTarget::LinkInterfaceLibraries const*
cmTarget::GetLinkInterfaceLibraries(const std::string& config,
                                    cmTarget const* head,
                                    bool usage_requirements_only) const
{
  // Imported targets have their own link interface.
  if(this->IsImported())
    {
    return this->GetImportLinkInterface(config, head, usage_requirements_only);
    }

  // Link interfaces are not supported for executables that do not
  // export symbols.
  if(this->GetType() == cmTarget::EXECUTABLE &&
     !this->IsExecutableWithExports())
    {
    return 0;
    }

  // Lookup any existing link interface for this configuration.
  std::string CONFIG = cmSystemTools::UpperCase(config);
  cmTargetInternals::HeadToLinkInterfaceMap& hm =
    (usage_requirements_only ?
     this->Internal->LinkInterfaceUsageRequirementsOnlyMap[CONFIG] :
     this->Internal->LinkInterfaceMap[CONFIG]);

  // If the link interface does not depend on the head target
  // then return the one we computed first.
  if(!hm.empty() && !hm.begin()->second.HadHeadSensitiveCondition)
    {
    return &hm.begin()->second;
    }

  cmTargetInternals::OptionalLinkInterface& iface = hm[head];
  if(!iface.LibrariesDone)
    {
    iface.LibrariesDone = true;
    this->Internal->ComputeLinkInterfaceLibraries(
      this, config, iface, head, usage_requirements_only);
    }

  return iface.Exists? &iface : 0;
}